

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_type.cpp
# Opt level: O0

ostream * operator<<(ostream *p_os,TextureType p_texture_type)

{
  ostream *poVar1;
  TextureType p_texture_type_local;
  ostream *p_os_local;
  
  switch(p_texture_type) {
  case SPECULAR:
    std::operator<<(p_os,"TextureType::SPECULAR");
    break;
  case DIFFUSE:
    std::operator<<(p_os,"TextureType::DIFFUSE");
    break;
  case NORMAL:
    std::operator<<(p_os,"TextureType::NORMAL");
    break;
  case HEIGHT:
    std::operator<<(p_os,"TextureType::HEIGHT");
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"unhandled switch case ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/src/enums/texture_type.cpp"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  return p_os;
}

Assistant:

std::ostream &operator<<(std::ostream &p_os, const TextureType p_texture_type)
{
    switch (p_texture_type)
    {
    case TextureType::DIFFUSE:
    {
        p_os << "TextureType::DIFFUSE";
        break;
    };
    case TextureType::HEIGHT:
    {
        p_os << "TextureType::HEIGHT";
        break;
    };
    case TextureType::NORMAL:
    {
        p_os << "TextureType::NORMAL";
        break;
    };
    case TextureType::SPECULAR:
    {
        p_os << "TextureType::SPECULAR";
        break;
    };
    default:
    {
        UNHANDLED_SWITCH_CASE(__LINE__, __FILE__);
    };
    };
    return p_os;
}